

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyItemNum(Scl_Tree_t *p,Scl_Item_t *pRoot,char *pName)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  Scl_Item_t *pSVar8;
  
  uVar2 = pRoot->Child;
  iVar3 = p->nItems;
  if ((int)uVar2 < iVar3) {
    iVar1 = 0;
    if ((-1 < (int)uVar2) && (p->pItems != (Scl_Item_t *)0x0)) {
      pSVar8 = p->pItems + uVar2;
      pcVar4 = p->pContents;
      iVar1 = 0;
      do {
        iVar5 = (pSVar8->Key).Beg;
        iVar7 = (pSVar8->Key).End - iVar5;
        iVar5 = strncmp(pcVar4 + iVar5,pName,(long)iVar7);
        if (iVar5 == 0) {
          sVar6 = strlen(pName);
          iVar1 = iVar1 + (uint)(iVar7 == (int)sVar6);
        }
        uVar2 = pSVar8->Next;
        if (iVar3 <= (int)uVar2) goto LAB_003e4675;
      } while ((-1 < (int)uVar2) && (pSVar8 = p->pItems + uVar2, p->pItems != (Scl_Item_t *)0x0));
    }
    return iVar1;
  }
LAB_003e4675:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyItemNum( Scl_Tree_t * p, Scl_Item_t * pRoot, char * pName )
{
    Scl_Item_t * pItem;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pRoot, pItem, pName )
        Counter++;
    return Counter;
}